

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicState.cpp
# Opt level: O0

GraphicState * __thiscall GraphicState::operator=(GraphicState *this,GraphicState *inGraphicState)

{
  GraphicState *inGraphicState_local;
  GraphicState *this_local;
  
  this->mFont = inGraphicState->mFont;
  this->mFontSize = inGraphicState->mFontSize;
  std::__cxx11::string::operator=
            ((string *)&this->mPlacedFontName,(string *)&inGraphicState->mPlacedFontName);
  this->mPlacedFontSize = inGraphicState->mPlacedFontSize;
  return this;
}

Assistant:

GraphicState& GraphicState::operator=(const GraphicState& inGraphicState)
{
	mFont = inGraphicState.mFont;
	mFontSize = inGraphicState.mFontSize;
	mPlacedFontName = inGraphicState.mPlacedFontName;
    mPlacedFontSize = inGraphicState.mPlacedFontSize;
	return *this;

}